

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gui.cpp
# Opt level: O0

void __thiscall nivalis::Plotter::Plotter(Plotter *this,bool use_latex)

{
  uint64_t uVar1;
  allocator<char> *__a;
  byte in_SIL;
  Plotter *in_RDI;
  Plotter *in_stack_fffffffffffffe70;
  allocator<char> *in_stack_fffffffffffffea0;
  char *in_stack_fffffffffffffea8;
  Environment *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  string *psVar2;
  undefined1 mode_explicit;
  Environment *this_01;
  allocator<char> local_b9;
  string local_b8 [39];
  allocator<char> local_91;
  string local_90 [39];
  undefined1 local_69 [40];
  allocator<char> local_41;
  string local_40 [55];
  byte local_9;
  
  local_9 = in_SIL & 1;
  in_RDI->use_latex = (bool)local_9;
  (in_RDI->view).xmin = 0.0;
  (in_RDI->view).ymax = 0.0;
  (in_RDI->view).swid = 0;
  (in_RDI->view).shigh = 0;
  (in_RDI->view).xmax = 0.0;
  (in_RDI->view).ymin = 0.0;
  (in_RDI->view).swid = 1000;
  (in_RDI->view).shigh = 600;
  in_RDI->curr_func = 0;
  in_RDI->enable_axes = true;
  in_RDI->enable_grid = true;
  in_RDI->polar_grid = false;
  std::vector<nivalis::Function,_std::allocator<nivalis::Function>_>::vector
            ((vector<nivalis::Function,_std::allocator<nivalis::Function>_> *)0x13c93c);
  std::__cxx11::string::string((string *)&in_RDI->func_error);
  std::vector<nivalis::SliderData,_std::allocator<nivalis::SliderData>_>::vector
            ((vector<nivalis::SliderData,_std::allocator<nivalis::SliderData>_> *)0x13c96e);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)0x13c98a);
  std::__cxx11::string::string((string *)&in_RDI->slider_error);
  in_RDI->focus_on_editor = true;
  in_RDI->require_update = false;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x13c9d0);
  std::__cxx11::string::string((string *)&in_RDI->marker_text);
  in_RDI->marker_clickable_radius = 8;
  in_RDI->passive_marker_click_behavior = PASSIVE_MARKER_CLICK_DRAG_TRACE;
  in_RDI->max_functions_find_all_crit_points = 5;
  in_RDI->max_functions_find_crit_points = 0x32;
  Environment::Environment((Environment *)in_stack_fffffffffffffe70);
  std::mutex::mutex((mutex *)0x13ca48);
  std::vector<nivalis::DrawBufferObject,_std::allocator<nivalis::DrawBufferObject>_>::vector
            ((vector<nivalis::DrawBufferObject,_std::allocator<nivalis::DrawBufferObject>_> *)
             0x13ca61);
  psVar2 = &in_RDI->bg_bitmap;
  std::__cxx11::string::string((string *)psVar2);
  mode_explicit = (undefined1)((ulong)psVar2 >> 0x38);
  psVar2 = (string *)&in_RDI->pt_markers;
  std::vector<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_>::vector
            ((vector<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_> *)0x13ca93);
  this_01 = (Environment *)&in_RDI->grid;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x13caaf);
  in_RDI->loss_detail = false;
  std::deque<nivalis::color::color,_std::allocator<nivalis::color::color>_>::deque
            ((deque<nivalis::color::color,_std::allocator<nivalis::color::color>_> *)0x13cad2);
  in_RDI->last_expr_color = 0;
  std::chrono::
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                *)in_stack_fffffffffffffe70);
  in_RDI->next_func_name = 0;
  reset_view(in_RDI);
  add_func(in_stack_fffffffffffffe70);
  in_RDI->drag_view = false;
  in_RDI->drag_trace = false;
  in_RDI->drag_marker = -1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
  uVar1 = Environment::addr_of(this_01,psVar2,(bool)mode_explicit);
  in_RDI->x_var = (uint32_t)uVar1;
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator(&local_41);
  __s = &in_RDI->env;
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_69;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__s,in_stack_fffffffffffffea0);
  __a = (allocator<char> *)Environment::addr_of(this_01,psVar2,(bool)mode_explicit);
  in_RDI->y_var = (uint32_t)__a;
  std::__cxx11::string::~string((string *)(local_69 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__s,__a);
  uVar1 = Environment::addr_of(this_01,psVar2,(bool)mode_explicit);
  in_RDI->t_var = (uint32_t)uVar1;
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator(&local_91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__s,__a);
  uVar1 = Environment::addr_of(this_01,psVar2,(bool)mode_explicit);
  in_RDI->r_var = (uint32_t)uVar1;
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator(&local_b9);
  return;
}

Assistant:

Plotter::Plotter(bool use_latex)
    : view{SCREEN_WIDTH, SCREEN_HEIGHT, 0., 0., 0., 0.}, use_latex(use_latex)
{
    reset_view();
    add_func();
    drag_trace = drag_view = false;
    drag_marker = -1;

    x_var = env.addr_of("x", false);
    y_var = env.addr_of("y", false);
    t_var = env.addr_of("t", false);
    r_var = env.addr_of("r", false);
}